

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void writeJson(char *fout,CUPDLPwork *work)

{
  FILE *__stream;
  long in_RSI;
  char *in_RDI;
  FILE *fptr;
  
  printf("--------------------------------\n");
  printf("--- saving to %s\n",in_RDI);
  printf("--------------------------------\n");
  __stream = fopen(in_RDI,"w");
  fprintf(__stream,"{");
  fprintf(__stream,"\"solver\":\"%s\",","cuPDLP-C");
  fprintf(__stream,"\"nIter\":%d,",(ulong)**(uint **)(in_RSI + 0x30));
  fprintf(__stream,"\"nAtyCalls\":%d,",(ulong)*(uint *)(*(long *)(in_RSI + 0x30) + 0x48));
  fprintf(__stream,"\"nAxCalls\":%d,",(ulong)*(uint *)(*(long *)(in_RSI + 0x30) + 0x4c));
  fprintf(__stream,"\"dSolvingBeg\":%f,",*(undefined8 *)(*(long *)(in_RSI + 0x30) + 0x10));
  fprintf(__stream,"\"dSolvingTime\":%f,",*(undefined8 *)(*(long *)(in_RSI + 0x30) + 8));
  fprintf(__stream,"\"dPresolveTime\":%f,",*(undefined8 *)(*(long *)(in_RSI + 0x30) + 0x20));
  fprintf(__stream,"\"dScalingTime\":%f,",*(undefined8 *)(*(long *)(in_RSI + 0x30) + 0x18));
  fprintf(__stream,"\"dPrimalObj\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 8));
  fprintf(__stream,"\"dDualObj\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x10));
  fprintf(__stream,"\"dPrimalFeas\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x28));
  fprintf(__stream,"\"dDualFeas\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x30));
  fprintf(__stream,"\"dPrimalObjAverage\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x108))
  ;
  fprintf(__stream,"\"dDualObjAverage\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x110));
  fprintf(__stream,"\"dPrimalFeasAverage\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x128)
         );
  fprintf(__stream,"\"dDualFeasAverage\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x130));
  fprintf(__stream,"\"dDualityGap\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x18));
  fprintf(__stream,"\"dDualityGapAverage\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x118)
         );
  if (*(int *)(*(long *)(in_RSI + 0x10) + 0x184) == 1) {
    fprintf(__stream,"\"dRelPrimalFeas\":%.14f,",
            *(double *)(*(long *)(in_RSI + 0x10) + 0x128) /
            (*(double *)(*(long *)(in_RSI + 0x28) + 0x40) + 1.0));
    fprintf(__stream,"\"dRelDualFeas\":%.14f,",
            *(double *)(*(long *)(in_RSI + 0x10) + 0x130) /
            (*(double *)(*(long *)(in_RSI + 0x28) + 0x38) + 1.0));
    fprintf(__stream,"\"dRelDualityGap\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x138));
  }
  else {
    fprintf(__stream,"\"dRelPrimalFeas\":%.14f,",
            *(double *)(*(long *)(in_RSI + 0x10) + 0x28) /
            (*(double *)(*(long *)(in_RSI + 0x28) + 0x40) + 1.0));
    fprintf(__stream,"\"dRelDualFeas\":%.14f,",
            *(double *)(*(long *)(in_RSI + 0x10) + 0x30) /
            (*(double *)(*(long *)(in_RSI + 0x28) + 0x38) + 1.0));
    fprintf(__stream,"\"dRelDualityGap\":%.14f,",*(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x38));
  }
  fprintf(__stream,"\"terminationCode\":\"%s\",",
          termCodeNames[*(uint *)(*(long *)(in_RSI + 0x10) + 0x180)]);
  fprintf(__stream,"\"terminationIterate\":\"%s\",",
          termIterateNames[*(uint *)(*(long *)(in_RSI + 0x10) + 0x184)]);
  fprintf(__stream,"\"primalCode\":\"%s\",",
          termCodeNames[*(uint *)(*(long *)(in_RSI + 0x10) + 0x80)]);
  fprintf(__stream,"\"dualCode\":\"%s\",",termCodeNames[*(uint *)(*(long *)(in_RSI + 0x10) + 0x84)])
  ;
  fprintf(__stream,"\"terminationInfeasIterate\":\"%s\"",
          termIterateNames[*(uint *)(*(long *)(in_RSI + 0x10) + 0x88)]);
  fprintf(__stream,"}");
  fclose(__stream);
  return;
}

Assistant:

void writeJson(const char *fout, CUPDLPwork *work) {
  FILE *fptr;

  cupdlp_printf("--------------------------------\n");
  cupdlp_printf("--- saving to %s\n", fout);
  cupdlp_printf("--------------------------------\n");
  // Open a file in writing mode
  fptr = fopen(fout, "w");

  fprintf(fptr, "{");

  // solver
  fprintf(fptr, "\"solver\":\"%s\",", "cuPDLP-C");

  // timers
  fprintf(fptr, "\"nIter\":%d,", work->timers->nIter);
  fprintf(fptr, "\"nAtyCalls\":%d,", work->timers->nAtyCalls);
  fprintf(fptr, "\"nAxCalls\":%d,", work->timers->nAxCalls);
  fprintf(fptr, "\"dSolvingBeg\":%f,", work->timers->dSolvingBeg);
  fprintf(fptr, "\"dSolvingTime\":%f,", work->timers->dSolvingTime);
  fprintf(fptr, "\"dPresolveTime\":%f,", work->timers->dPresolveTime);
  fprintf(fptr, "\"dScalingTime\":%f,", work->timers->dScalingTime);
#ifndef CUPDLP_CPU
  fprintf(fptr, "\"AllocMem_CopyMatToDeviceTime\":%f,",
          work->timers->AllocMem_CopyMatToDeviceTime);
  fprintf(fptr, "\"CopyVecToDeviceTime\":%f,",
          work->timers->CopyVecToDeviceTime);
  fprintf(fptr, "\"CopyVecToHostTime\":%f,", work->timers->CopyVecToHostTime);
  fprintf(fptr, "\"DeviceMatVecProdTime\":%f,",
          work->timers->DeviceMatVecProdTime);
#endif
  // residuals
  fprintf(fptr, "\"dPrimalObj\":%.14f,", work->resobj->dPrimalObj);
  fprintf(fptr, "\"dDualObj\":%.14f,", work->resobj->dDualObj);
  fprintf(fptr, "\"dPrimalFeas\":%.14f,", work->resobj->dPrimalFeas);
  fprintf(fptr, "\"dDualFeas\":%.14f,", work->resobj->dDualFeas);
  fprintf(fptr, "\"dPrimalObjAverage\":%.14f,",
          work->resobj->dPrimalObjAverage);
  fprintf(fptr, "\"dDualObjAverage\":%.14f,", work->resobj->dDualObjAverage);
  fprintf(fptr, "\"dPrimalFeasAverage\":%.14f,",
          work->resobj->dPrimalFeasAverage);
  fprintf(fptr, "\"dDualFeasAverage\":%.14f,", work->resobj->dDualFeasAverage);
  fprintf(fptr, "\"dDualityGap\":%.14f,", work->resobj->dDualityGap);
  fprintf(fptr, "\"dDualityGapAverage\":%.14f,",
          work->resobj->dDualityGapAverage);
  // fprintf(fptr, "\"dComplementarity\":%.14f,",
  // work->resobj->dComplementarity); fprintf(fptr,
  // "\"dComplementarityAverage\":%.14f,",
  //         work->resobj->dComplementarityAverage);

  //  todo should this be added to postsolve?
  // todo, fix dNormCost and this
  if (work->resobj->termIterate == AVERAGE_ITERATE) {
    fprintf(fptr, "\"dRelPrimalFeas\":%.14f,",
            work->resobj->dPrimalFeasAverage / (1.0 + work->scaling->dNormRhs));
    fprintf(fptr, "\"dRelDualFeas\":%.14f,",
            work->resobj->dDualFeasAverage / (1.0 + work->scaling->dNormCost));
    fprintf(fptr, "\"dRelDualityGap\":%.14f,", work->resobj->dRelObjGapAverage);
  } else {
    fprintf(fptr, "\"dRelPrimalFeas\":%.14f,",
            work->resobj->dPrimalFeas / (1.0 + work->scaling->dNormRhs));
    fprintf(fptr, "\"dRelDualFeas\":%.14f,",
            work->resobj->dDualFeas / (1.0 + work->scaling->dNormCost));
    fprintf(fptr, "\"dRelDualityGap\":%.14f,", work->resobj->dRelObjGap);
  }
  fprintf(fptr, "\"terminationCode\":\"%s\",",
          termCodeNames[work->resobj->termCode]);
  fprintf(fptr, "\"terminationIterate\":\"%s\",",
          termIterateNames[work->resobj->termIterate]);
  fprintf(fptr, "\"primalCode\":\"%s\",",
          termCodeNames[work->resobj->primalCode]);
  fprintf(fptr, "\"dualCode\":\"%s\",", termCodeNames[work->resobj->dualCode]);
  fprintf(fptr, "\"terminationInfeasIterate\":\"%s\"",
          termIterateNames[work->resobj->termInfeasIterate]);

  fprintf(fptr, "}");
  // Close the file
  fclose(fptr);
}